

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_go_to_breakfast_time(tgestate_t *state)

{
  tgestate_t *in_RDI;
  
  in_RDI->bell = '(';
  queue_message(in_RDI,message_BREAKFAST_TIME);
  set_route_go_to_breakfast((tgestate_t *)0x115d57);
  return;
}

Assistant:

static void event_go_to_breakfast_time(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_BREAKFAST_TIME);
  set_route_go_to_breakfast(state);
}